

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stage.cc
# Opt level: O1

bool tinyusdz::anon_unknown_28::ComputeAbsPathAndAssignPrimIdRec
               (Stage *stage,Prim *prim,Path *parentPath,uint32_t depth,bool assign_prim_id,
               bool force_assign_prim_id,string *err)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer puVar2;
  Prim *pPVar3;
  bool bVar4;
  unsigned_long uVar5;
  long *plVar6;
  long *plVar7;
  size_type *psVar8;
  Prim *prim_00;
  bool bVar9;
  Path abs_path;
  long *local_140;
  long local_138;
  long local_130;
  long lStack_128;
  Path local_120;
  string local_50;
  
  if (0x8000000 < depth) {
    if (err != (string *)0x0) {
      ::std::__cxx11::string::append((char *)err);
    }
    return false;
  }
  if ((prim->_elementPath)._prim_part._M_string_length == 0) {
    if (err == (string *)0x0) {
      return false;
    }
    Path::full_path_name_abi_cxx11_(&local_50,parentPath);
    plVar6 = (long *)::std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,0x3c76e2);
    plVar7 = plVar6 + 2;
    if ((long *)*plVar6 == plVar7) {
      local_130 = *plVar7;
      lStack_128 = plVar6[3];
      local_140 = &local_130;
    }
    else {
      local_130 = *plVar7;
      local_140 = (long *)*plVar6;
    }
    local_138 = plVar6[1];
    *plVar6 = (long)plVar7;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    plVar6 = (long *)::std::__cxx11::string::append((char *)&local_140);
    paVar1 = &local_120._prim_part.field_2;
    psVar8 = (size_type *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar8) {
      local_120._prim_part.field_2._M_allocated_capacity = *psVar8;
      local_120._prim_part.field_2._8_8_ = plVar6[3];
      local_120._prim_part._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_120._prim_part.field_2._M_allocated_capacity = *psVar8;
      local_120._prim_part._M_dataplus._M_p = (pointer)*plVar6;
    }
    local_120._prim_part._M_string_length = plVar6[1];
    *plVar6 = (long)psVar8;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    ::std::__cxx11::string::_M_append((char *)err,(ulong)local_120._prim_part._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._prim_part._M_dataplus._M_p != paVar1) {
      operator_delete(local_120._prim_part._M_dataplus._M_p,
                      local_120._prim_part.field_2._M_allocated_capacity + 1);
    }
    if (local_140 != &local_130) {
      operator_delete(local_140,local_130 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p == &local_50.field_2) {
      return false;
    }
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    return false;
  }
  Path::AppendPrim(&local_120,parentPath,(string *)&prim->_elementPath);
  Path::operator=(&prim->_abs_path,&local_120);
  if ((assign_prim_id) && ((force_assign_prim_id || (prim->_prim_id < 1)))) {
    puVar2 = (stage->_prim_id_allocator).freeList_.
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if ((stage->_prim_id_allocator).freeList_.
        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start == puVar2) {
      uVar5 = (stage->_prim_id_allocator).counter_;
      if (1 < uVar5 + 1) {
        (stage->_prim_id_allocator).counter_ = uVar5 + 1;
        goto LAB_00312906;
      }
      bVar9 = false;
    }
    else {
      uVar5 = puVar2[-1];
      (stage->_prim_id_allocator).freeList_.
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = puVar2 + -1;
      (stage->_prim_id_allocator).dirty_ = true;
LAB_00312906:
      bVar9 = true;
    }
    if (bVar9) {
      prim->_prim_id = uVar5;
    }
    else if (err != (string *)0x0) {
      ::std::__cxx11::string::append((char *)err);
    }
    if (!bVar9) {
      bVar9 = false;
      goto LAB_00312b1a;
    }
  }
  prim_00 = (prim->_children).super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>.
            _M_impl.super__Vector_impl_data._M_start;
  pPVar3 = (prim->_children).super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  bVar9 = prim_00 == pPVar3;
  if (!bVar9) {
    bVar4 = ComputeAbsPathAndAssignPrimIdRec
                      (stage,prim_00,&local_120,depth + 1,assign_prim_id,force_assign_prim_id,err);
    if (bVar4) {
      do {
        prim_00 = prim_00 + 1;
        bVar9 = prim_00 == pPVar3;
        if (bVar9) break;
        bVar4 = ComputeAbsPathAndAssignPrimIdRec
                          (stage,prim_00,&local_120,depth + 1,assign_prim_id,force_assign_prim_id,
                           err);
      } while (bVar4);
    }
  }
LAB_00312b1a:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120._element._M_dataplus._M_p != &local_120._element.field_2) {
    operator_delete(local_120._element._M_dataplus._M_p,
                    local_120._element.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120._variant_part_str._M_dataplus._M_p != &local_120._variant_part_str.field_2) {
    operator_delete(local_120._variant_part_str._M_dataplus._M_p,
                    local_120._variant_part_str.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120._variant_selection_part._M_dataplus._M_p !=
      &local_120._variant_selection_part.field_2) {
    operator_delete(local_120._variant_selection_part._M_dataplus._M_p,
                    local_120._variant_selection_part.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120._variant_part._M_dataplus._M_p != &local_120._variant_part.field_2) {
    operator_delete(local_120._variant_part._M_dataplus._M_p,
                    local_120._variant_part.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120._prop_part._M_dataplus._M_p != &local_120._prop_part.field_2) {
    operator_delete(local_120._prop_part._M_dataplus._M_p,
                    local_120._prop_part.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120._prim_part._M_dataplus._M_p != &local_120._prim_part.field_2) {
    operator_delete(local_120._prim_part._M_dataplus._M_p,
                    local_120._prim_part.field_2._M_allocated_capacity + 1);
    return bVar9;
  }
  return bVar9;
}

Assistant:

bool ComputeAbsPathAndAssignPrimIdRec(const Stage &stage, Prim &prim,
                                      const Path &parentPath, uint32_t depth,
                                      bool assign_prim_id,
                                      bool force_assign_prim_id = true,
                                      std::string *err = nullptr) {
  if (depth > 1024 * 1024 * 128) {
    // too deep node.
    if (err) {
      (*err) += "Prim hierarchy too deep.\n";
    }
    return false;
  }

  if (prim.element_name().empty()) {
    // Prim's elementName must not be empty.
    if (err) {
      (*err) += "Prim's elementName is empty. Prim's parent Path = " +
                parentPath.full_path_name() + "\n";
    }
    return false;
  }

  Path abs_path = parentPath.AppendPrim(prim.element_name());

  prim.absolute_path() = abs_path;
  if (assign_prim_id) {
    if (force_assign_prim_id || (prim.prim_id() < 1)) {
      uint64_t prim_id{0};
      if (!stage.allocate_prim_id(&prim_id)) {
        if (err) {
          (*err) += "Failed to assign unique Prim ID.\n";
        }
        return false;
      }
      prim.prim_id() = int64_t(prim_id);
    }
  }

  for (Prim &child : prim.children()) {
    if (!ComputeAbsPathAndAssignPrimIdRec(stage, child, abs_path, depth + 1,
                                          assign_prim_id, force_assign_prim_id,
                                          err)) {
      return false;
    }
  }

  return true;
}